

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O3

int convert_YCoCg_to_RGB(uchar *orig,int width,int height,int channels)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar uVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  uchar uVar9;
  
  iVar7 = -1;
  if ((((orig != (uchar *)0x0) && (0 < width)) && (0 < height)) && (0xfffffffd < channels - 5U)) {
    if (channels == 3) {
      uVar8 = 0;
      do {
        bVar1 = orig[uVar8 + 1];
        bVar2 = orig[uVar8 + 2];
        iVar7 = (((uint)orig[uVar8] + (uint)bVar1) - (uint)bVar2) + -0x80;
        if (0x7e < iVar7) {
          iVar7 = 0x7f;
        }
        cVar6 = (char)iVar7;
        if (iVar7 < -0x7f) {
          cVar6 = -0x80;
        }
        iVar7 = (uint)bVar2 + (uint)bVar1 + -0x80;
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        uVar9 = (uchar)iVar7;
        if (iVar7 < 1) {
          uVar9 = '\0';
        }
        uVar5 = (uint)bVar1 - ((uint)orig[uVar8] + (uint)bVar2);
        if (-2 < (int)uVar5) {
          uVar5 = 0xffffffff;
        }
        orig[uVar8] = cVar6 + 0x80;
        uVar4 = (uchar)uVar5;
        if (uVar5 < 0xffffff01) {
          uVar4 = '\0';
        }
        orig[uVar8 + 1] = uVar9;
        orig[uVar8 + 2] = uVar4;
        uVar8 = uVar8 + 3;
      } while (uVar8 < (uint)(height * width * 3));
    }
    else {
      uVar8 = 0;
      do {
        bVar1 = orig[uVar8];
        bVar2 = orig[uVar8 + 1];
        uVar9 = orig[uVar8 + 2];
        bVar3 = orig[uVar8 + 3];
        iVar7 = ((uint)bVar1 - (uint)bVar2) + (uint)bVar3;
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        uVar4 = (uchar)iVar7;
        if (iVar7 < 1) {
          uVar4 = '\0';
        }
        orig[uVar8] = uVar4;
        iVar7 = (uint)bVar2 + (uint)bVar3 + -0x80;
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        uVar5 = (uint)bVar3 - ((uint)bVar1 + (uint)bVar2);
        if (-2 < (int)uVar5) {
          uVar5 = 0xffffffff;
        }
        orig[uVar8 + 1] = (uchar)iVar7;
        uVar4 = (uchar)uVar5;
        if (uVar5 < 0xffffff01) {
          uVar4 = '\0';
        }
        orig[uVar8 + 2] = uVar4;
        orig[uVar8 + 3] = uVar9;
        uVar8 = uVar8 + 4;
      } while (uVar8 < (uint)(height * width * 4));
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int
	convert_YCoCg_to_RGB
	(
		unsigned char* orig,
		int width, int height, int channels
	)
{
	int i;
	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 3) || (channels > 4) ||
		(orig == NULL) )
	{
		/*	nothing to do	*/
		return -1;
	}
	/*	do the conversion	*/
	if( channels == 3 )
	{
		for( i = 0; i < width*height*3; i += 3 )
		{
			int co = orig[i+0] - 128;
			int y  = orig[i+1];
			int cg = orig[i+2] - 128;
			/*	R	*/
			orig[i+0] = clamp_byte( y + co - cg );
			/*	G	*/
			orig[i+1] = clamp_byte( y + cg );
			/*	B	*/
			orig[i+2] = clamp_byte( y - co - cg );
		}
	} else
	{
		for( i = 0; i < width*height*4; i += 4 )
		{
			int co = orig[i+0] - 128;
			int cg = orig[i+1] - 128;
			unsigned char a  = orig[i+2];
			int y  = orig[i+3];
			/*	R	*/
			orig[i+0] = clamp_byte( y + co - cg );
			/*	G	*/
			orig[i+1] = clamp_byte( y + cg );
			/*	B	*/
			orig[i+2] = clamp_byte( y - co - cg );
			/*	A	*/
			orig[i+3] = a;
		}
	}
	/*	done	*/
	return 0;
}